

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O1

void __thiscall
TEST_WiningStateTest_LastDiscard_Test::TEST_WiningStateTest_LastDiscard_Test
          (TEST_WiningStateTest_LastDiscard_Test *this)

{
  _Rb_tree_header *p_Var1;
  WiningState *this_00;
  
  memset(this,0,0xc0);
  Utest::Utest((Utest *)this);
  (this->super_TEST_GROUP_CppUTestGroupWiningStateTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupWiningStateTest_001dd920;
  p_Var1 = &(this->super_TEST_GROUP_CppUTestGroupWiningStateTest).h.tiles._M_t._M_impl.
            super__Rb_tree_header;
  (this->super_TEST_GROUP_CppUTestGroupWiningStateTest).h.tiles._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_TEST_GROUP_CppUTestGroupWiningStateTest).h.tiles._M_t._M_impl.
           super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_TEST_GROUP_CppUTestGroupWiningStateTest).h.tiles._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_TEST_GROUP_CppUTestGroupWiningStateTest).h.tiles._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x18) = p_Var1;
  (this->super_TEST_GROUP_CppUTestGroupWiningStateTest).h.tiles._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  (this->super_TEST_GROUP_CppUTestGroupWiningStateTest).h.melds.
  super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_TEST_GROUP_CppUTestGroupWiningStateTest).h.melds.
  super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_TEST_GROUP_CppUTestGroupWiningStateTest).h.melds.
  super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_TEST_GROUP_CppUTestGroupWiningStateTest).h.ready_type = not_ready;
  this_00 = &(this->super_TEST_GROUP_CppUTestGroupWiningStateTest).s;
  mahjong::WiningState::WiningState(this_00);
  mahjong::DoubligFactorCounter::DoubligFactorCounter
            (&(this->super_TEST_GROUP_CppUTestGroupWiningStateTest).c,
             &(this->super_TEST_GROUP_CppUTestGroupWiningStateTest).h,this_00);
  (this->super_TEST_GROUP_CppUTestGroupWiningStateTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupWiningStateTest_001dd540;
  return;
}

Assistant:

TEST(WiningStateTest, LastDiscard)
{
	addNoWiningHand();

	WinByDiscardSituation situation;
	situation.is_last_discard = true;

	winByDiscard(situation);
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::LastDiscard));
	CHECK_EQUAL(1, r.doubling_factor);
}